

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

void lgx_str_dup(lgx_str_t *src,lgx_str_t *dst)

{
  uint uVar1;
  
  uVar1 = src->length;
  if (((ulong)uVar1 == 0) || (src->buffer == (char *)0x0)) {
    __assert_fail("src->length > 0 && src->buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/common/str.c"
                  ,0x50,"void lgx_str_dup(lgx_str_t *, lgx_str_t *)");
  }
  if ((dst->size != 0) && (dst->buffer != (char *)0x0)) {
    if (uVar1 <= dst->size) {
      memcpy(dst->buffer,src->buffer,(ulong)uVar1);
      dst->length = src->length;
      return;
    }
    __assert_fail("dst->size >= src->length",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/common/str.c"
                  ,0x52,"void lgx_str_dup(lgx_str_t *, lgx_str_t *)");
  }
  __assert_fail("dst->size > 0 && dst->buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/common/str.c"
                ,0x51,"void lgx_str_dup(lgx_str_t *, lgx_str_t *)");
}

Assistant:

void lgx_str_dup(lgx_str_t *src, lgx_str_t *dst) {
    assert(src->length > 0 && src->buffer);
    assert(dst->size > 0 && dst->buffer);
    assert(dst->size >= src->length);

    memcpy(dst->buffer, src->buffer, src->length);
    dst->length = src->length;
}